

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeImportThrowing(TranslateToFuzzReader *this,Type type)

{
  string_view target;
  bool bVar1;
  Call *pCVar2;
  initializer_list<wasm::Expression_*> __l;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_50;
  Const *local_38;
  allocator_type local_29;
  
  if (type.id == 0) {
    bVar1 = Random::oneIn(&this->random,2);
    if (bVar1) {
      local_38 = Builder::makeConst<int>(&this->builder,0);
    }
    else {
      local_38 = (Const *)makeConst(this,(Type)0x2);
    }
    target = (this->throwImportName).super_IString.str;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_38;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&local_50,__l,
               &local_29);
    pCVar2 = Builder::makeCall(&this->builder,(Name)target,
                               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               &local_50,(Type)0x0,false);
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              (&local_50);
    return (Expression *)pCVar2;
  }
  __assert_fail("type == Type::none",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x4d4,"Expression *wasm::TranslateToFuzzReader::makeImportThrowing(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeImportThrowing(Type type) {
  // TODO: This and makeThrow should probably be rare, as they halt the program.

  // We throw from the import, so this call appears to be none and not
  // unreachable.
  assert(type == Type::none);

  // An argument of 0 means to throw a JS exception, and otherwise the value in
  // a wasm tag. Emit 0 or non-zero with ~equal probability.
  Expression* arg;
  if (oneIn(2)) {
    arg = builder.makeConst(int32_t(0));
  } else {
    arg = makeConst(Type::i32);
  }
  return builder.makeCall(throwImportName, {arg}, Type::none);
}